

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void TraceLog(int logType,char *text,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buffer [128];
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (logTypeLevel <= logType) {
    args[0].reg_save_area = local_c8;
    args[0].overflow_arg_area = &stack0x00000008;
    args[0].gp_offset = 0x10;
    args[0].fp_offset = 0x30;
    local_b8 = in_RDX;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    if (traceLog == (TraceLogCallback)0x0) {
      buffer[0x70] = '\0';
      buffer[0x71] = '\0';
      buffer[0x72] = '\0';
      buffer[0x73] = '\0';
      buffer[0x74] = '\0';
      buffer[0x75] = '\0';
      buffer[0x76] = '\0';
      buffer[0x77] = '\0';
      buffer[0x78] = '\0';
      buffer[0x79] = '\0';
      buffer[0x7a] = '\0';
      buffer[0x7b] = '\0';
      buffer[0x7c] = '\0';
      buffer[0x7d] = '\0';
      buffer[0x7e] = '\0';
      buffer[0x7f] = '\0';
      buffer[0x60] = '\0';
      buffer[0x61] = '\0';
      buffer[0x62] = '\0';
      buffer[99] = '\0';
      buffer[100] = '\0';
      buffer[0x65] = '\0';
      buffer[0x66] = '\0';
      buffer[0x67] = '\0';
      buffer[0x68] = '\0';
      buffer[0x69] = '\0';
      buffer[0x6a] = '\0';
      buffer[0x6b] = '\0';
      buffer[0x6c] = '\0';
      buffer[0x6d] = '\0';
      buffer[0x6e] = '\0';
      buffer[0x6f] = '\0';
      buffer[0x50] = '\0';
      buffer[0x51] = '\0';
      buffer[0x52] = '\0';
      buffer[0x53] = '\0';
      buffer[0x54] = '\0';
      buffer[0x55] = '\0';
      buffer[0x56] = '\0';
      buffer[0x57] = '\0';
      buffer[0x58] = '\0';
      buffer[0x59] = '\0';
      buffer[0x5a] = '\0';
      buffer[0x5b] = '\0';
      buffer[0x5c] = '\0';
      buffer[0x5d] = '\0';
      buffer[0x5e] = '\0';
      buffer[0x5f] = '\0';
      buffer[0x40] = '\0';
      buffer[0x41] = '\0';
      buffer[0x42] = '\0';
      buffer[0x43] = '\0';
      buffer[0x44] = '\0';
      buffer[0x45] = '\0';
      buffer[0x46] = '\0';
      buffer[0x47] = '\0';
      buffer[0x48] = '\0';
      buffer[0x49] = '\0';
      buffer[0x4a] = '\0';
      buffer[0x4b] = '\0';
      buffer[0x4c] = '\0';
      buffer[0x4d] = '\0';
      buffer[0x4e] = '\0';
      buffer[0x4f] = '\0';
      buffer[0x30] = '\0';
      buffer[0x31] = '\0';
      buffer[0x32] = '\0';
      buffer[0x33] = '\0';
      buffer[0x34] = '\0';
      buffer[0x35] = '\0';
      buffer[0x36] = '\0';
      buffer[0x37] = '\0';
      buffer[0x38] = '\0';
      buffer[0x39] = '\0';
      buffer[0x3a] = '\0';
      buffer[0x3b] = '\0';
      buffer[0x3c] = '\0';
      buffer[0x3d] = '\0';
      buffer[0x3e] = '\0';
      buffer[0x3f] = '\0';
      buffer[0x20] = '\0';
      buffer[0x21] = '\0';
      buffer[0x22] = '\0';
      buffer[0x23] = '\0';
      buffer[0x24] = '\0';
      buffer[0x25] = '\0';
      buffer[0x26] = '\0';
      buffer[0x27] = '\0';
      buffer[0x28] = '\0';
      buffer[0x29] = '\0';
      buffer[0x2a] = '\0';
      buffer[0x2b] = '\0';
      buffer[0x2c] = '\0';
      buffer[0x2d] = '\0';
      buffer[0x2e] = '\0';
      buffer[0x2f] = '\0';
      buffer[0x10] = '\0';
      buffer[0x11] = '\0';
      buffer[0x12] = '\0';
      buffer[0x13] = '\0';
      buffer[0x14] = '\0';
      buffer[0x15] = '\0';
      buffer[0x16] = '\0';
      buffer[0x17] = '\0';
      buffer[0x18] = '\0';
      buffer[0x19] = '\0';
      buffer[0x1a] = '\0';
      buffer[0x1b] = '\0';
      buffer[0x1c] = '\0';
      buffer[0x1d] = '\0';
      buffer[0x1e] = '\0';
      buffer[0x1f] = '\0';
      buffer[0] = '\0';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      buffer[4] = '\0';
      buffer[5] = '\0';
      buffer[6] = '\0';
      buffer[7] = '\0';
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      switch(logType) {
      case 1:
        buffer[0] = 'T';
        buffer[1] = 'R';
        buffer[2] = 'A';
        buffer[3] = 'C';
        buffer[4] = 'E';
        buffer[5] = ':';
        buffer[6] = ' ';
        buffer[7] = '\0';
        break;
      case 2:
        buffer[0] = 'D';
        buffer[1] = 'E';
        buffer[2] = 'B';
        buffer[3] = 'U';
        buffer[4] = 'G';
        buffer[5] = ':';
        buffer[6] = ' ';
        buffer[7] = '\0';
        break;
      case 3:
        builtin_strncpy(buffer,"INFO: ",7);
        buffer[7] = '\0';
        break;
      case 4:
        builtin_strncpy(buffer,"WARNING: ",10);
        buffer[10] = '\0';
        buffer[0xb] = '\0';
        buffer[0xc] = '\0';
        buffer[0xd] = '\0';
        buffer[0xe] = '\0';
        buffer[0xf] = '\0';
        break;
      case 5:
        buffer[0] = 'E';
        buffer[1] = 'R';
        buffer[2] = 'R';
        buffer[3] = 'O';
        buffer[4] = 'R';
        buffer[5] = ':';
        buffer[6] = ' ';
        buffer[7] = '\0';
        break;
      case 6:
        buffer[0] = 'F';
        buffer[1] = 'A';
        buffer[2] = 'T';
        buffer[3] = 'A';
        buffer[4] = 'L';
        buffer[5] = ':';
        buffer[6] = ' ';
        buffer[7] = '\0';
      }
      strcat(buffer,text);
      sVar1 = strlen(buffer);
      (buffer + sVar1)[0] = '\n';
      (buffer + sVar1)[1] = '\0';
      vprintf(buffer,args);
      if (logType == 5) {
        exit(1);
      }
    }
    else {
      (*traceLog)(logType,text,args);
    }
  }
  return;
}

Assistant:

void TraceLog(int logType, const char *text, ...)
{
#if defined(SUPPORT_TRACELOG)
    // Message has level below current threshold, don't emit
    if (logType < logTypeLevel) return;

    va_list args;
    va_start(args, text);

    if (traceLog)
    {
        traceLog(logType, text, args);
        va_end(args);
        return;
    }

#if defined(PLATFORM_ANDROID)
    switch(logType)
    {
        case LOG_TRACE: __android_log_vprint(ANDROID_LOG_VERBOSE, "raylib", text, args); break;
        case LOG_DEBUG: __android_log_vprint(ANDROID_LOG_DEBUG, "raylib", text, args); break;
        case LOG_INFO: __android_log_vprint(ANDROID_LOG_INFO, "raylib", text, args); break;
        case LOG_WARNING: __android_log_vprint(ANDROID_LOG_WARN, "raylib", text, args); break;
        case LOG_ERROR: __android_log_vprint(ANDROID_LOG_ERROR, "raylib", text, args); break;
        case LOG_FATAL: __android_log_vprint(ANDROID_LOG_FATAL, "raylib", text, args); break;
        default: break;
    }
#else
    char buffer[MAX_TRACELOG_MSG_LENGTH] = { 0 };

    switch (logType)
    {
        case LOG_TRACE: strcpy(buffer, "TRACE: "); break;
        case LOG_DEBUG: strcpy(buffer, "DEBUG: "); break;
        case LOG_INFO: strcpy(buffer, "INFO: "); break;
        case LOG_WARNING: strcpy(buffer, "WARNING: "); break;
        case LOG_ERROR: strcpy(buffer, "ERROR: "); break;
        case LOG_FATAL: strcpy(buffer, "FATAL: "); break;
        default: break;
    }

    strcat(buffer, text);
    strcat(buffer, "\n");
    vprintf(buffer, args);
#endif

    va_end(args);

    if (logType == LOG_ERROR) exit(1);  // If error, exit program

#endif  // SUPPORT_TRACELOG
}